

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_RenderingAttributes::Write(ON_RenderingAttributes *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool local_21;
  bool rc;
  ON_BinaryArchive *archive_local;
  ON_RenderingAttributes *this_local;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    local_21 = ON_BinaryArchive::WriteArray(archive,&this->m_materials);
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    if (!bVar1) {
      local_21 = false;
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RenderingAttributes::Write( ON_BinaryArchive& archive ) const
{
  bool rc = archive.BeginWrite3dmChunk( TCODE_ANONYMOUS_CHUNK, 1, 0 );
  if ( !rc )
    return false;
  for(;;)
  {
    rc = archive.WriteArray(m_materials);
    if ( !rc ) break;

    break;
  }
  if ( !archive.EndWrite3dmChunk() )
    rc = false;
  return rc;
}